

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form4_Resize(ResizeForm4 Resize)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t *x;
  uint32_t *y;
  uint32_t *width;
  uint32_t *height;
  value_type_conflict4 *__val_3;
  value_type_conflict4 *__val;
  value_type_conflict4 *__val_1;
  value_type_conflict4 *__val_2;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  ImageTemplate<unsigned_char> local_58;
  
  Unit_Test::intensityArray(&intensity,2);
  uVar1 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,uVar1,0,0,&output);
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  uVar1 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&output,uVar1,0,0,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  x = (uint32_t *)operator_new(8);
  x[0] = 0;
  x[1] = 0;
  y = (uint32_t *)operator_new(8);
  y[0] = 0;
  y[1] = 0;
  width = (uint32_t *)operator_new(8);
  width[0] = 0;
  width[1] = 0;
  height = (uint32_t *)operator_new(8);
  height[0] = 0;
  height[1] = 0;
  Unit_Test::generateRoi(&input,x,y,width,height);
  Unit_Test::generateRoi(&output,x + 1,y + 1,width + 1,height + 1);
  (*Resize)(&input,*x,*y,*width,*height,&output,x[1],y[1],width[1],height[1]);
  bVar2 = Unit_Test::verifyImage
                    (&output,x[1],y[1],width[1],height[1],
                     *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  operator_delete(height);
  operator_delete(width);
  operator_delete(y);
  operator_delete(x);
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  input._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&input);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool form4_Resize(ResizeForm4 Resize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = uniformImage( intensity[0] );
        PenguinV_Image::Image output = uniformImage( intensity[1] );

        std::vector < uint32_t > roiX( 2 ), roiY( 2 ), roiWidth( 2 ), roiHeight( 2 );

        generateRoi( input, roiX[0], roiY[0], roiWidth[0], roiHeight[0] );
        generateRoi( output, roiX[1], roiY[1], roiWidth[1], roiHeight[1] );

        Resize( input, roiX[0], roiY[0], roiWidth[0], roiHeight[0], output, roiX[1], roiY[1], roiWidth[1], roiHeight[1] );

        return verifyImage( output, roiX[1], roiY[1], roiWidth[1], roiHeight[1], intensity[0] );
    }